

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas.c
# Opt level: O0

void IDASensPredict(IDAMem IDA_mem,N_Vector *yySens,N_Vector *ypSens)

{
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  int j;
  undefined4 local_1c;
  
  for (local_1c = 0; local_1c <= *(int *)(in_RDI + 0x4b8); local_1c = local_1c + 1) {
    *(undefined8 *)(*(long *)(in_RDI + 0x7f8) + (long)local_1c * 8) = 0x3ff0000000000000;
  }
  N_VLinearCombinationVectorArray
            (*(undefined4 *)(in_RDI + 0xa0),*(int *)(in_RDI + 0x4b8) + 1,
             *(undefined8 *)(in_RDI + 0x7f8),in_RDI + 0x350,in_RSI);
  N_VLinearCombinationVectorArray
            (*(undefined4 *)(in_RDI + 0xa0),*(undefined4 *)(in_RDI + 0x4b8),in_RDI + 0x250,
             in_RDI + 0x358,in_RDX);
  return;
}

Assistant:

static void IDASensPredict(IDAMem IDA_mem, N_Vector* yySens, N_Vector* ypSens)
{
  int j;

  for (j = 0; j <= IDA_mem->ida_kk; j++) { IDA_mem->ida_cvals[j] = ONE; }

  (void)N_VLinearCombinationVectorArray(IDA_mem->ida_Ns, IDA_mem->ida_kk + 1,
                                        IDA_mem->ida_cvals, IDA_mem->ida_phiS,
                                        yySens);

  (void)N_VLinearCombinationVectorArray(IDA_mem->ida_Ns, IDA_mem->ida_kk,
                                        IDA_mem->ida_gamma + 1,
                                        IDA_mem->ida_phiS + 1, ypSens);
}